

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O3

uint64_t __thiscall flexbuffers::Reference::AsUInt64(Reference *this)

{
  byte bVar1;
  double *pdVar2;
  int iVar3;
  int *piVar4;
  uint64_t *puVar5;
  uint64_t uVar6;
  ulong *puVar7;
  ulong uVar8;
  long lVar9;
  double dVar10;
  char *endptr;
  uint8_t *local_38;
  Vector local_30;
  
  uVar6 = 0;
  switch(this->type_) {
  case FBT_INT:
    puVar5 = (uint64_t *)this->data_;
    bVar1 = this->parent_width_;
    if (bVar1 < 4) {
      if (bVar1 < 2) {
        return (long)(char)(byte)*puVar5;
      }
      return (long)(short)(ushort)*puVar5;
    }
    if (bVar1 < 8) {
      return (long)(int)(uint)*puVar5;
    }
    goto LAB_00147c30;
  case FBT_FLOAT:
    pdVar2 = (double *)this->data_;
    bVar1 = this->parent_width_;
    if (bVar1 < 4) {
      if (bVar1 < 2) {
        iVar3 = (int)*(char *)pdVar2;
      }
      else {
        iVar3 = (int)*(short *)pdVar2;
      }
LAB_00147c97:
      dVar10 = (double)iVar3;
    }
    else if (bVar1 < 8) {
      dVar10 = (double)*(float *)pdVar2;
    }
    else {
      dVar10 = *pdVar2;
    }
    goto LAB_00147c9b;
  case FBT_KEY:
  case FBT_MAP:
    break;
  case FBT_STRING:
    AsString((String *)&local_30,this);
    if (local_30.super_Sized.super_Object.data_ == (uint8_t *)0x0) {
      __assert_fail("str",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/util.h"
                    ,0x11f,
                    "bool flatbuffers::StringToIntegerImpl(T *, const char *const, const int, const bool) [T = unsigned long]"
                   );
    }
    piVar4 = __errno_location();
    *piVar4 = 0;
    local_38 = local_30.super_Sized.super_Object.data_;
    uVar6 = strtoull_l((char *)local_30.super_Sized.super_Object.data_,(char **)&local_38,10,
                       flatbuffers::ClassicLocale::instance_);
    if (((local_38 == local_30.super_Sized.super_Object.data_) || (*local_38 != '\0')) ||
       (*piVar4 != 0)) {
      uVar6 = 0;
    }
    break;
  case FBT_INDIRECT_INT:
    puVar7 = (ulong *)this->data_;
    bVar1 = this->parent_width_;
    if (bVar1 < 4) {
      if (bVar1 < 2) {
        uVar8 = (ulong)(byte)*puVar7;
      }
      else {
        uVar8 = (ulong)(ushort)*puVar7;
      }
    }
    else if (bVar1 < 8) {
      uVar8 = (ulong)(uint)*puVar7;
    }
    else {
      uVar8 = *puVar7;
    }
    lVar9 = -uVar8;
    bVar1 = this->byte_width_;
    if (bVar1 < 4) {
      if (bVar1 < 2) {
        return (long)*(char *)((long)puVar7 + lVar9);
      }
      return (long)*(short *)((long)puVar7 + lVar9);
    }
    if (bVar1 < 8) {
      return (long)*(int *)((long)puVar7 + lVar9);
    }
    goto LAB_00147d29;
  case FBT_INDIRECT_UINT:
    puVar7 = (ulong *)this->data_;
    bVar1 = this->parent_width_;
    if (bVar1 < 4) {
      if (bVar1 < 2) {
        uVar8 = (ulong)(byte)*puVar7;
      }
      else {
        uVar8 = (ulong)(ushort)*puVar7;
      }
    }
    else if (bVar1 < 8) {
      uVar8 = (ulong)(uint)*puVar7;
    }
    else {
      uVar8 = *puVar7;
    }
    lVar9 = -uVar8;
    bVar1 = this->byte_width_;
    if (bVar1 < 4) {
      if (bVar1 < 2) {
        return (ulong)*(byte *)((long)puVar7 + lVar9);
      }
      return (ulong)*(ushort *)((long)puVar7 + lVar9);
    }
    if (bVar1 < 8) {
      return (ulong)*(uint *)((long)puVar7 + lVar9);
    }
LAB_00147d29:
    uVar6 = *(uint64_t *)((long)puVar7 + lVar9);
    break;
  case FBT_INDIRECT_FLOAT:
    puVar7 = (ulong *)this->data_;
    bVar1 = this->parent_width_;
    if (bVar1 < 4) {
      if (bVar1 < 2) {
        uVar8 = (ulong)(byte)*puVar7;
      }
      else {
        uVar8 = (ulong)(ushort)*puVar7;
      }
    }
    else if (bVar1 < 8) {
      uVar8 = (ulong)(uint)*puVar7;
    }
    else {
      uVar8 = *puVar7;
    }
    lVar9 = -uVar8;
    bVar1 = this->byte_width_;
    if (bVar1 < 4) {
      if (bVar1 < 2) {
        iVar3 = (int)*(char *)((long)puVar7 + lVar9);
      }
      else {
        iVar3 = (int)*(short *)((long)puVar7 + lVar9);
      }
      goto LAB_00147c97;
    }
    if (bVar1 < 8) {
      dVar10 = (double)*(float *)((long)puVar7 + lVar9);
    }
    else {
      dVar10 = *(double *)((long)puVar7 + lVar9);
    }
LAB_00147c9b:
    uVar6 = (long)(dVar10 - 9.223372036854776e+18) & (long)dVar10 >> 0x3f | (long)dVar10;
    break;
  case FBT_VECTOR:
    AsVector(&local_30,this);
    uVar6 = local_30.super_Sized.size_;
    break;
  default:
    if (this->type_ != FBT_BOOL) {
      return 0;
    }
  case FBT_UINT:
    puVar5 = (uint64_t *)this->data_;
    bVar1 = this->parent_width_;
    if (bVar1 < 4) {
      if (bVar1 < 2) {
        uVar6 = (ulong)(byte)*puVar5;
      }
      else {
        uVar6 = (ulong)(ushort)*puVar5;
      }
    }
    else if (bVar1 < 8) {
      uVar6 = (ulong)(uint)*puVar5;
    }
    else {
LAB_00147c30:
      uVar6 = *puVar5;
    }
  }
  return uVar6;
}

Assistant:

uint64_t AsUInt64() const {
    if (type_ == FBT_UINT) {
      // A fast path for the common case.
      return ReadUInt64(data_, parent_width_);
    } else
      switch (type_) {
        case FBT_INDIRECT_UINT: return ReadUInt64(Indirect(), byte_width_);
        case FBT_INT: return ReadInt64(data_, parent_width_);
        case FBT_INDIRECT_INT: return ReadInt64(Indirect(), byte_width_);
        case FBT_FLOAT:
          return static_cast<uint64_t>(ReadDouble(data_, parent_width_));
        case FBT_INDIRECT_FLOAT:
          return static_cast<uint64_t>(ReadDouble(Indirect(), byte_width_));
        case FBT_NULL: return 0;
        case FBT_STRING: return flatbuffers::StringToUInt(AsString().c_str());
        case FBT_VECTOR: return static_cast<uint64_t>(AsVector().size());
        case FBT_BOOL: return ReadUInt64(data_, parent_width_);
        default:
          // Convert other things to uint.
          return 0;
      }
  }